

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O2

void __thiscall CountOverJoin::~CountOverJoin(CountOverJoin *this)

{
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountOverJoin_00152c20;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::string::~string((string *)&this->_pathToFiles);
  return;
}

Assistant:

CountOverJoin::~CountOverJoin(){}